

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::print_hand(Board *this,Hand *hand)

{
  bool bVar1;
  ostream *poVar2;
  Card local_48 [4];
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_28;
  __normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_20;
  iterator it;
  Hand *hand_local;
  Board *this_local;
  
  it._M_current = (Card *)hand;
  poVar2 = std::operator<<((ostream *)&std::cout,"Printing hand....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_20._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::begin(hand);
  while( true ) {
    local_28._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(hand);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Card is ");
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator->
              (&local_20);
    Card::Card2Str_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator++
              (&local_20);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Board::print_hand(Hand hand)
{
  std::cout << "Printing hand...." << std::endl;
  for(std::vector<Card>::iterator it = hand.begin(); it != hand.end(); ++it) {
    std::cout << "Card is " << it->Card2Str() << std::endl;
  }
  std::cout << "...." << std::endl;
}